

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O0

void Ssw_MatchingExtendOne(Aig_Man_t *p,Vec_Ptr_t *vNodes)

{
  bool bVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar3;
  int local_44;
  int local_34;
  int local_30;
  int iFan;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pNext;
  Vec_Ptr_t *vNodes_local;
  Aig_Man_t *p_local;
  
  local_34 = -1;
  Vec_PtrClear(vNodes);
  Aig_ManIncrementTravId(p);
  iFan = 0;
  do {
    iVar2 = Vec_PtrSize(p->vObjs);
    if (iVar2 <= iFan) {
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iFan);
    if ((pObj_00 != (Aig_Obj_t *)0x0) &&
       (((iVar2 = Aig_ObjIsNode(pObj_00), iVar2 != 0 || (iVar2 = Aig_ObjIsCi(pObj_00), iVar2 != 0))
        && ((pObj_00->field_5).pData == (void *)0x0)))) {
      iVar2 = Saig_ObjIsLo(p,pObj_00);
      if (iVar2 != 0) {
        pAVar3 = Saig_ObjLoToLi(p,pObj_00);
        pObj = Aig_ObjFanin0(pAVar3);
        if ((((pObj->field_5).pData != (void *)0x0) &&
            (iVar2 = Aig_ObjIsTravIdCurrent(p,pObj), iVar2 == 0)) &&
           (iVar2 = Aig_ObjIsConst1(pObj), iVar2 == 0)) {
          Aig_ObjSetTravIdCurrent(p,pObj);
          Vec_PtrPush(vNodes,pObj);
        }
      }
      iVar2 = Aig_ObjIsNode(pObj_00);
      if (iVar2 != 0) {
        pAVar3 = Aig_ObjFanin0(pObj_00);
        if (((pAVar3->field_5).pData != (void *)0x0) &&
           (iVar2 = Aig_ObjIsTravIdCurrent(p,pAVar3), iVar2 == 0)) {
          Aig_ObjSetTravIdCurrent(p,pAVar3);
          Vec_PtrPush(vNodes,pAVar3);
        }
        pObj = Aig_ObjFanin1(pObj_00);
        if (((pObj->field_5).pData != (void *)0x0) &&
           (iVar2 = Aig_ObjIsTravIdCurrent(p,pObj), iVar2 == 0)) {
          Aig_ObjSetTravIdCurrent(p,pObj);
          Vec_PtrPush(vNodes,pObj);
        }
      }
      if (p->pFanData == (int *)0x0) {
        __assert_fail("p->pFanData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                      ,0xa7,"void Ssw_MatchingExtendOne(Aig_Man_t *, Vec_Ptr_t *)");
      }
      local_30 = 0;
      while( true ) {
        bVar1 = false;
        if (local_30 < (int)((uint)(*(ulong *)&pObj_00->field_0x18 >> 6) & 0x3ffffff)) {
          if (local_30 == 0) {
            local_44 = Aig_ObjFanout0Int(p,pObj_00->Id);
          }
          else {
            local_44 = Aig_ObjFanoutNext(p,local_34);
          }
          local_34 = local_44;
          pObj = Aig_ManObj(p,local_44 >> 1);
          bVar1 = true;
        }
        if (!bVar1) break;
        iVar2 = Saig_ObjIsPo(p,pObj);
        if (iVar2 == 0) {
          iVar2 = Saig_ObjIsLi(p,pObj);
          if (iVar2 != 0) {
            pObj = Saig_ObjLiToLo(p,pObj);
          }
          if (((pObj->field_5).pData != (void *)0x0) &&
             (iVar2 = Aig_ObjIsTravIdCurrent(p,pObj), iVar2 == 0)) {
            Aig_ObjSetTravIdCurrent(p,pObj);
            Vec_PtrPush(vNodes,pObj);
          }
        }
        local_30 = local_30 + 1;
      }
    }
    iFan = iFan + 1;
  } while( true );
}

Assistant:

void Ssw_MatchingExtendOne( Aig_Man_t * p, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pNext, * pObj;
    int i, k, iFan = -1;
    Vec_PtrClear( vNodes );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( pObj->pData != NULL )
            continue;
        if ( Saig_ObjIsLo(p, pObj) )
        {
            pNext = Saig_ObjLoToLi(p, pObj);
            pNext = Aig_ObjFanin0(pNext);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) && !Aig_ObjIsConst1(pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        if ( Aig_ObjIsNode(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
            pNext = Aig_ObjFanin1(pObj);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
        Aig_ObjForEachFanout( p, pObj, pNext, iFan, k )
        {
            if ( Saig_ObjIsPo(p, pNext) )
                continue;
            if ( Saig_ObjIsLi(p, pNext) )
                pNext = Saig_ObjLiToLo(p, pNext);
            if ( pNext->pData && !Aig_ObjIsTravIdCurrent(p, pNext) )
            {
                Aig_ObjSetTravIdCurrent(p, pNext);
                Vec_PtrPush( vNodes, pNext );
            }
        }
    }
}